

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indiancal.cpp
# Opt level: O2

double icu_63::gregorianToJD(int32_t year,int32_t month,int32_t date)

{
  int iVar1;
  UBool UVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  iVar1 = year + -1;
  dVar4 = uprv_floor_63((double)(iVar1 / 4));
  dVar5 = uprv_floor_63((double)(iVar1 / 100));
  dVar6 = uprv_floor_63((double)(iVar1 / 400));
  iVar3 = 0;
  if (2 < month) {
    UVar2 = isGregorianLeap(year);
    iVar3 = -1 - (uint)(UVar2 == '\0');
  }
  dVar7 = uprv_floor_63((double)(date + iVar3 + (month * 0x16f + -0x16a) / 0xc));
  return dVar7 + (((double)(iVar1 * 0x16d) + 1721424.5 + dVar4) - dVar5) + dVar6;
}

Assistant:

static double gregorianToJD(int32_t year, int32_t month, int32_t date) {
   double julianDay = (JULIAN_EPOCH - 1) +
      (365 * (year - 1)) +
      uprv_floor((year - 1) / 4) +
      (-uprv_floor((year - 1) / 100)) +
      uprv_floor((year - 1) / 400) +
      uprv_floor((((367 * month) - 362) / 12) +
            ((month <= 2) ? 0 :
             (isGregorianLeap(year) ? -1 : -2)
            ) +
            date);

   return julianDay;
}